

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate1.cpp
# Opt level: O1

void test_qclab_qgates_PointerGate1<float>(void)

{
  long lVar1;
  float *pfVar2;
  void *pvVar3;
  long lVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  undefined4 uVar8;
  float *pfVar9;
  pointer *__ptr;
  long lVar10;
  pointer *__ptr_2;
  bool bVar11;
  char *pcVar12;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  float *pfVar14;
  pointer *__ptr_12;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  vector<int,_std::allocator<int>_> qubits;
  AssertionResult gtest_ar_7;
  PointerGate1<float> PX;
  PointerGate1<float> PZ;
  PointerGate1<float> P;
  AssertionResult gtest_ar__6;
  stringstream qasm2;
  PauliZ<float> Z;
  stringstream qasm;
  PauliX<float> X2;
  PauliX<float> X;
  undefined1 local_410 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_408;
  pointer local_400;
  undefined1 local_3f8 [8];
  undefined8 local_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  AssertHelper local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3d0;
  AssertHelper *local_3c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3c0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_3b8;
  AssertHelper local_3b0;
  undefined8 local_3a8;
  AssertHelper *local_3a0;
  undefined **local_398;
  undefined4 local_390;
  undefined4 uStack_38c;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  internal local_380 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  undefined1 local_370 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360 [7];
  ios_base aiStack_2f0 [264];
  AssertHelper local_1e8;
  undefined4 local_1e0;
  undefined1 local_1d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [7];
  ios_base local_158 [264];
  AssertHelper local_50;
  undefined4 local_48;
  undefined **local_40;
  undefined4 local_38;
  
  local_38 = 0;
  local_40 = &PTR_nbQubits_00520ed8;
  _local_390 = 0;
  local_398 = &PTR_nbQubits_005237d8;
  local_370._0_4_ = 1;
  local_3f8._0_4_ = 1;
  local_388._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )&local_40;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.nbQubits()","1",(int *)local_370,(int *)local_3f8);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0xd,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  cVar5 = (*(code *)(*(undefined ***)
                      local_388._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)[1])();
  local_370[0] = (internal)cVar5;
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar5 == '\0') {
    testing::Message::Message((Message *)local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)local_370,(AssertionResult *)"P.fixed()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0xe,(char *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != local_1c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),
                      local_1c8[0]._M_allocated_capacity + 1);
    }
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3f8 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  iVar7 = (*(code *)(*(undefined ***)
                      local_388._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)[3])();
  local_370._0_4_ = iVar7 + uStack_38c;
  local_3f8 = (undefined1  [8])((ulong)local_3f8 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.qubit()","0",(int *)local_370,(int *)local_3f8);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x10,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  local_370._0_4_ = uStack_38c;
  local_3f8 = (undefined1  [8])((ulong)local_3f8 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.offset()","0",(int *)local_370,(int *)local_3f8);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x11,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  local_370 = (undefined1  [8])
              local_388._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
  local_3f8 = (undefined1  [8])&local_40;
  testing::internal::CmpHelperEQ<qclab::qgates::QGate1<float>*,qclab::qgates::PauliX<float>*>
            ((internal *)local_1d8,"P.ptr()","&X",(QGate1<float> **)local_370,
             (PauliX<float> **)local_3f8);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x12,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_370 != (undefined1  [8])0x0) {
      (*(code *)(*(undefined ***)local_370)[1])();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  local_1d8._0_4_ = (**(code **)((long)local_398 + 0x18))();
  __l._M_len = 1;
  __l._M_array = (iterator)local_1d8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_410,__l,(allocator_type *)local_370);
  local_370 = (undefined1  [8])((long)local_408 - (long)local_410 >> 2);
  local_3f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1d8,"qubits.size()","1",(unsigned_long *)local_370,(int *)local_3f8);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x16,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  local_370 = (undefined1  [8])((ulong)local_370 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"qubits[0]","0",(int *)local_410,(int *)local_370);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x17,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_3f8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_3f8);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  (*(code *)(*(undefined ***)
              local_388._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl)[7])(local_1d8);
  pfVar9 = (float *)operator_new__(0x10);
  pfVar9[0] = 0.0;
  pfVar9[1] = 1.0;
  pfVar9[2] = 1.0;
  pfVar9[3] = 0.0;
  if (CONCAT44(local_1d8._4_4_,local_1d8._0_4_) == 2) {
    if ((*pfVar9 == *(float *)&(local_1d0->_M_dataplus)._M_p) &&
       (!NAN(*pfVar9) && !NAN(*(float *)&(local_1d0->_M_dataplus)._M_p))) {
      in_R9 = (char *)0x0;
      bVar11 = false;
      pbVar13 = local_1d0;
      pfVar14 = pfVar9;
      while( true ) {
        lVar10 = 0;
        do {
          if (lVar10 == 1) goto LAB_0025f402;
          lVar4 = lVar10 + 1;
          lVar1 = lVar10 + 1;
          pfVar2 = (float *)((long)&(pbVar13->_M_dataplus)._M_p + lVar10 * 4 + 4);
        } while ((pfVar14[lVar4] == *pfVar2) &&
                (lVar10 = lVar1, !NAN(pfVar14[lVar4]) && !NAN(*pfVar2)));
        if (lVar1 < 2) break;
LAB_0025f402:
        in_R9 = in_R9 + 1;
        bVar11 = 1 < (long)in_R9;
        if (in_R9 == (char *)0x2) break;
        pfVar14 = pfVar14 + 2;
        pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &pbVar13->_M_string_length;
        if ((pfVar9[(long)in_R9 * 2] != *(float *)&(&local_1d0->_M_dataplus)[(long)in_R9]._M_p) ||
           (NAN(pfVar9[(long)in_R9 * 2]) ||
            NAN(*(float *)&(&local_1d0->_M_dataplus)[(long)in_R9]._M_p))) break;
      }
      goto LAB_0025f24c;
    }
  }
  bVar11 = false;
LAB_0025f24c:
  local_370[0] = (internal)bVar11;
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  operator_delete__(pfVar9);
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete__(local_1d0);
  }
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)local_370,
               (AssertionResult *)"P.matrix() == X.matrix()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x1a,(char *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_));
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != local_1c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),
                      local_1c8[0]._M_allocated_capacity + 1);
    }
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3f8 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  uVar8 = (*(code *)(*(undefined ***)
                      local_388._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)[0xb])
                    (local_388._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,local_1c8,uStack_38c);
  local_3f8._0_4_ = uVar8;
  local_3d8.data_ = (AssertHelperData *)((ulong)local_3d8.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_370,"P.toQASM( qasm )","0",(int *)local_3f8,(int *)&local_3d8);
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3f8);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x1e,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3f8 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_3f8,"qasm.str()","\"x q[0];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
             (char (*) [9])0x46e0f9);
  if (local_370 != (undefined1  [8])local_360) {
    operator_delete((void *)local_370,local_360[0]._M_allocated_capacity + 1);
  }
  if (local_3f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_3f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_3f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x1f,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_370 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_370 + 8))();
    }
  }
  if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3f0,local_3f0);
  }
  uStack_38c = 3;
  local_3f8._0_4_ = 3;
  local_3d8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_370,"P.offset()","3",(int *)local_3f8,(int *)&local_3d8);
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3f8);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x23,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_3f8 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  iVar7 = (*(code *)(*(undefined ***)
                      local_388._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)[3])();
  local_3f8._0_4_ = iVar7 + uStack_38c;
  local_3d8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_370,"P.qubit()","3",(int *)local_3f8,(int *)&local_3d8);
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3f8);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x24,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_3f8 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  uVar8 = (**(code **)((long)local_398 + 0x18))();
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_3d8;
  local_3d8.data_._0_4_ = uVar8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_370,__l_00,(allocator_type *)&local_3b0);
  local_3d8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3f8,"P.qubits()[0]","3",(int *)local_370,(int *)&local_3d8);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_370 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_370,local_360[0]._M_allocated_capacity - (long)local_370);
  }
  if (local_3f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_3f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_3f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x25,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_370 + 8))();
    }
  }
  if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3f0,local_3f0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_370);
  uVar8 = (*(code *)(*(undefined ***)
                      local_388._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl)[0xb])
                    (local_388._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,local_360,uStack_38c);
  local_3d8.data_._0_4_ = uVar8;
  local_3b0.data_ = (AssertHelperData *)((ulong)local_3b0.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3f8,"P.toQASM( qasm2 )","0",(int *)&local_3d8,(int *)&local_3b0);
  if (local_3f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3d8);
    if (local_3f0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_3f0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x27,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3d8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3d8.data_ + 8))();
    }
  }
  if (local_3f0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3f0,local_3f0);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&local_3d8,"qasm2.str()","\"x q[3];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8,
             (char (*) [9])"x q[3];\n");
  if (local_3f8 != (undefined1  [8])&local_3e8) {
    operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
  }
  if (local_3d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_3f8);
    if (local_3d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_3d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x28,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if (local_3f8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_3f8 + 8))();
    }
  }
  if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,local_3d0);
  }
  cVar5 = (**(code **)((long)local_398 + 0x70))
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&local_398,&local_40);
  local_3d8.data_._0_1_ = (internal)cVar5;
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar5 == '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,(internal *)&local_3d8,(AssertionResult *)"P == X","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2b,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
  }
  if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,local_3d0);
  }
  cVar5 = (**(code **)((long)local_398 + 0x70))
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&local_398,&local_40);
  local_3d8.data_._0_1_ = (internal)cVar5;
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar5 == '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,(internal *)&local_3d8,(AssertionResult *)"P != X","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2c,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_1e8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
  }
  if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,local_3d0);
  }
  local_1e0 = 0;
  local_1e8.data_ = (AssertHelperData *)&PTR_nbQubits_00522568;
  cVar5 = (**(code **)((long)local_398 + 0x70))();
  local_3d8.data_ = (AssertHelperData *)(CONCAT71(local_3d8.data_._1_7_,cVar5) ^ 1);
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar5 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,(internal *)&local_3d8,(AssertionResult *)"P != Z","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2e,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
  }
  if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,local_3d0);
  }
  cVar5 = (**(code **)((long)local_398 + 0x70))
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&local_398,&local_1e8);
  local_3d8.data_ = (AssertHelperData *)(CONCAT71(local_3d8.data_._1_7_,cVar5) ^ 1);
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar5 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,(internal *)&local_3d8,(AssertionResult *)"P == Z","true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x2f,(char *)local_3f8);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3b0.data_ + 8))();
    }
  }
  if (local_3d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3d0,local_3d0);
  }
  local_3c8 = &local_50;
  local_48 = 0;
  local_50.data_ = (AssertHelperData *)&PTR_nbQubits_00520ed8;
  local_3d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3d8.data_ = (AssertHelperData *)&PTR_nbQubits_005237d8;
  local_3a8 = 0;
  local_3b0.data_ = (AssertHelperData *)&PTR_nbQubits_005237d8;
  local_3a0 = &local_1e8;
  local_380[0] = (internal)(**(code **)((long)local_398 + 0x70))();
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_380[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,local_380,(AssertionResult *)"P == PX","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x33,(char *)local_3f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3c0._M_head_impl + 8))();
    }
  }
  if (local_378 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_378,local_378);
  }
  local_380[0] = (internal)
                 (**(code **)((long)local_398 + 0x70))
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&local_398,&local_3d8);
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_380[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,local_380,(AssertionResult *)"P != PX","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x34,(char *)local_3f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3c0._M_head_impl + 8))();
    }
  }
  if (local_378 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_378,local_378);
  }
  bVar6 = (**(code **)((long)local_398 + 0x70))
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&local_398,&local_3b0);
  local_380[0] = (internal)(bVar6 ^ 1);
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar6 != 0) {
    testing::Message::Message((Message *)&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,local_380,(AssertionResult *)"P != PZ","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x35,(char *)local_3f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3c0._M_head_impl + 8))();
    }
  }
  if (local_378 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_378,local_378);
  }
  bVar6 = (**(code **)((long)local_398 + 0x70))
                    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)&local_398,&local_3b0);
  local_380[0] = (internal)(bVar6 ^ 1);
  local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar6 != 0) {
    testing::Message::Message((Message *)&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3f8,local_380,(AssertionResult *)"P == PZ","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x36,(char *)local_3f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3b8,(Message *)&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3b8);
    if (local_3f8 != (undefined1  [8])&local_3e8) {
      operator_delete((void *)local_3f8,local_3e8._M_allocated_capacity + 1);
    }
    if (local_3c0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_3c0._M_head_impl + 8))();
    }
  }
  if (local_378 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_378,local_378);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_370);
  std::ios_base::~ios_base(aiStack_2f0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  if (local_410 != (undefined1  [8])0x0) {
    operator_delete((void *)local_410,(long)local_400 - (long)local_410);
  }
  local_390 = 5;
  local_398 = &PTR_nbQubits_00520ed8;
  local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3f8 = (undefined1  [8])&PTR_nbQubits_005237d8;
  local_370._0_4_ = 1;
  local_410._0_4_ = 1;
  local_3e8._M_allocated_capacity =
       (size_type)
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&local_398;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.nbQubits()","1",(int *)local_370,(int *)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x3d,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  cVar5 = (**(code **)(*local_3e8._M_allocated_capacity + 8))();
  local_370[0] = (internal)cVar5;
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar5 == '\0') {
    testing::Message::Message((Message *)local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)local_370,(AssertionResult *)"P.fixed()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x3e,(char *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_));
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != local_1c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),
                      local_1c8[0]._M_allocated_capacity + 1);
    }
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  iVar7 = (**(code **)(*local_3e8._M_allocated_capacity + 0x18))();
  local_370._0_4_ = iVar7 + local_3f0._4_4_;
  local_410._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.qubit()","5",(int *)local_370,(int *)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x40,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  iVar7 = (*(code *)(((string *)((long)local_3f8 + 0x18))->_M_dataplus)._M_p)();
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_410;
  local_410._0_4_ = iVar7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1d8,__l_01,(allocator_type *)&local_3d8);
  local_410._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_370,"P.qubits()[0]","5",
             (int *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),(int *)local_410);
  pvVar3 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1c8[0]._M_allocated_capacity - (long)pvVar3);
  }
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1d8);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x41,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  local_370._0_4_ = local_3f0._4_4_;
  local_410 = (undefined1  [8])((ulong)local_410 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.offset()","0",(int *)local_370,(int *)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x42,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  local_370 = (undefined1  [8])local_3e8._M_allocated_capacity;
  local_410 = (undefined1  [8])&local_398;
  testing::internal::CmpHelperEQ<qclab::qgates::QGate1<float>*,qclab::qgates::PauliX<float>*>
            ((internal *)local_1d8,"P.ptr()","&X",(QGate1<float> **)local_370,
             (PauliX<float> **)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x43,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  uVar8 = (**(code **)(*local_3e8._M_allocated_capacity + 0x58))
                    (local_3e8._M_allocated_capacity,local_1c8,local_3f0._4_4_);
  local_410._0_4_ = uVar8;
  local_3d8.data_ = local_3d8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_370,"P.toQASM( qasm )","0",(int *)local_410,(int *)&local_3d8);
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_410);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x47,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_410,"qasm.str()","\"x q[5];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
             (char (*) [9])"x q[5];\n");
  if (local_370 != (undefined1  [8])local_360) {
    operator_delete((void *)local_370,local_360[0]._M_allocated_capacity + 1);
  }
  if (local_410[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_408 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_408->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x48,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_370 + 8))();
    }
  }
  if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_408,local_408);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  _local_390 = _local_390 & 0xffffffff00000000;
  local_398 = &PTR_nbQubits_00520ed8;
  local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000000;
  local_3f8 = (undefined1  [8])&PTR_nbQubits_005237d8;
  local_370._0_4_ = 1;
  local_410._0_4_ = 1;
  local_3e8._M_allocated_capacity =
       (size_type)
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&local_398;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.nbQubits()","1",(int *)local_370,(int *)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x4f,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  cVar5 = (**(code **)(*local_3e8._M_allocated_capacity + 8))();
  local_370[0] = (internal)cVar5;
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar5 == '\0') {
    testing::Message::Message((Message *)local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)local_370,(AssertionResult *)"P.fixed()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x50,(char *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_));
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != local_1c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),
                      local_1c8[0]._M_allocated_capacity + 1);
    }
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  iVar7 = (**(code **)(*local_3e8._M_allocated_capacity + 0x18))();
  local_370._0_4_ = iVar7 + local_3f0._4_4_;
  local_410._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.qubit()","3",(int *)local_370,(int *)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x52,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  iVar7 = (*(code *)(((string *)((long)local_3f8 + 0x18))->_M_dataplus)._M_p)();
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_410;
  local_410._0_4_ = iVar7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1d8,__l_02,(allocator_type *)&local_3d8);
  local_410._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_370,"P.qubits()[0]","3",
             (int *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),(int *)local_410);
  pvVar3 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1c8[0]._M_allocated_capacity - (long)pvVar3);
  }
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1d8);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x53,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  local_370._0_4_ = local_3f0._4_4_;
  local_410._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.offset()","3",(int *)local_370,(int *)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x54,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  local_370 = (undefined1  [8])local_3e8._M_allocated_capacity;
  local_410 = (undefined1  [8])&local_398;
  testing::internal::CmpHelperEQ<qclab::qgates::QGate1<float>*,qclab::qgates::PauliX<float>*>
            ((internal *)local_1d8,"P.ptr()","&X",(QGate1<float> **)local_370,
             (PauliX<float> **)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x55,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  uVar8 = (**(code **)(*local_3e8._M_allocated_capacity + 0x58))
                    (local_3e8._M_allocated_capacity,local_1c8,local_3f0._4_4_);
  local_410._0_4_ = uVar8;
  local_3d8.data_ = local_3d8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_370,"P.toQASM( qasm )","0",(int *)local_410,(int *)&local_3d8);
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_410);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x59,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_410,"qasm.str()","\"x q[3];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
             (char (*) [9])"x q[3];\n");
  if (local_370 != (undefined1  [8])local_360) {
    operator_delete((void *)local_370,local_360[0]._M_allocated_capacity + 1);
  }
  if (local_410[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_408 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_408->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x5a,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_370 + 8))();
    }
  }
  if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_408,local_408);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  local_390 = 4;
  local_398 = &PTR_nbQubits_00520ed8;
  local_3f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x300000000;
  local_3f8 = (undefined1  [8])&PTR_nbQubits_005237d8;
  local_370._0_4_ = 1;
  local_410._0_4_ = 1;
  local_3e8._M_allocated_capacity =
       (size_type)
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)&local_398;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.nbQubits()","1",(int *)local_370,(int *)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x61,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  cVar5 = (**(code **)(*local_3e8._M_allocated_capacity + 8))();
  local_370[0] = (internal)cVar5;
  local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar5 == '\0') {
    testing::Message::Message((Message *)local_410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1d8,(internal *)local_370,(AssertionResult *)"P.fixed()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x62,(char *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_));
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != local_1c8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),
                      local_1c8[0]._M_allocated_capacity + 1);
    }
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  iVar7 = (**(code **)(*local_3e8._M_allocated_capacity + 0x18))();
  local_370._0_4_ = iVar7 + local_3f0._4_4_;
  local_410._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.qubit()","7",(int *)local_370,(int *)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,100,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  iVar7 = (*(code *)(((string *)((long)local_3f8 + 0x18))->_M_dataplus)._M_p)();
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_410;
  local_410._0_4_ = iVar7;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_1d8,__l_03,(allocator_type *)&local_3d8);
  local_410._0_4_ = 7;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_370,"P.qubits()[0]","7",
             (int *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),(int *)local_410);
  pvVar3 = (void *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,local_1c8[0]._M_allocated_capacity - (long)pvVar3);
  }
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1d8);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x65,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if ((long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  local_370._0_4_ = local_3f0._4_4_;
  local_410._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1d8,"P.offset()","3",(int *)local_370,(int *)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x66,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  local_370 = (undefined1  [8])local_3e8._M_allocated_capacity;
  local_410 = (undefined1  [8])&local_398;
  testing::internal::CmpHelperEQ<qclab::qgates::QGate1<float>*,qclab::qgates::PauliX<float>*>
            ((internal *)local_1d8,"P.ptr()","&X",(QGate1<float> **)local_370,
             (PauliX<float> **)local_410);
  if (local_1d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x67,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_410,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_410);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_370 + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1d8);
  uVar8 = (**(code **)(*local_3e8._M_allocated_capacity + 0x58))
                    (local_3e8._M_allocated_capacity,local_1c8,local_3f0._4_4_);
  local_410._0_4_ = uVar8;
  local_3d8.data_ = local_3d8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_370,"P.toQASM( qasm )","0",(int *)local_410,(int *)&local_3d8);
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_410);
    if (local_368 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_368->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x6b,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_410 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_410 + 8))();
    }
  }
  if (local_368 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_370 + 8),local_368);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)local_410,"qasm.str()","\"x q[7];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_370,
             (char (*) [9])"x q[7];\n");
  if (local_370 != (undefined1  [8])local_360) {
    operator_delete((void *)local_370,local_360[0]._M_allocated_capacity + 1);
  }
  if (local_410[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_370);
    if (local_408 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = (local_408->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/PointerGate1.cpp"
               ,0x6c,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    if (local_370 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_370 + 8))();
    }
  }
  if (local_408 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_408,local_408);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1d8);
  std::ios_base::~ios_base(local_158);
  return;
}

Assistant:

void test_qclab_qgates_PointerGate1() {

  {
    qclab::qgates::PauliX< T >  X ;
    qclab::qgates::PointerGate1< T >  P( &X )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 0 ) ;      // qubit
    EXPECT_EQ( P.offset() , 0 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // qubits
    auto qubits = P.qubits() ;
    EXPECT_EQ( qubits.size() , 1 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;

    // matrix
    EXPECT_TRUE( P.matrix() == X.matrix() ) ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[0];\n" ) ;

    // setOffset
    P.setOffset( 3 ) ;
    EXPECT_EQ( P.offset() , 3 ) ;
    EXPECT_EQ( P.qubit() , 3 ) ;
    EXPECT_EQ( P.qubits()[0] , 3 ) ;
    std::stringstream qasm2 ;
    EXPECT_EQ( P.toQASM( qasm2 ) , 0 ) ;
    EXPECT_EQ( qasm2.str() , "x q[3];\n" ) ;

    // operators == and !=
    EXPECT_TRUE(  P == X ) ;
    EXPECT_FALSE( P != X ) ;
    qclab::qgates::PauliZ< T >  Z ;
    EXPECT_TRUE(  P != Z ) ;
    EXPECT_FALSE( P == Z ) ;
    qclab::qgates::PauliX< T >  X2 ;
    qclab::qgates::PointerGate1< T > PX( &X2 ) ;
    qclab::qgates::PointerGate1< T > PZ( &Z ) ;
    EXPECT_TRUE(  P == PX ) ;
    EXPECT_FALSE( P != PX ) ;
    EXPECT_TRUE(  P != PZ ) ;
    EXPECT_FALSE( P == PZ ) ;
  }

  {
    qclab::qgates::PauliX< T >  X( 5 ) ;
    qclab::qgates::PointerGate1< T >  P( &X )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 5 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 5 ) ;  // qubits
    EXPECT_EQ( P.offset() , 0 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[5];\n" ) ;
  }

  {
    qclab::qgates::PauliX< T >  X ;
    qclab::qgates::PointerGate1< T >  P( &X , 3 )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 3 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 3 ) ;  // qubits
    EXPECT_EQ( P.offset() , 3 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[3];\n" ) ;
  }

  {
    qclab::qgates::PauliX< T >  X( 4 ) ;
    qclab::qgates::PointerGate1< T >  P( &X , 3 )  ;

    EXPECT_EQ( P.nbQubits() , 1 ) ;   // nbQubits
    EXPECT_TRUE( P.fixed() ) ;        // fixed
    EXPECT_FALSE( P.controlled() ) ;  // controlled
    EXPECT_EQ( P.qubit() , 7 ) ;      // qubit
    EXPECT_EQ( P.qubits()[0] , 7 ) ;  // qubits
    EXPECT_EQ( P.offset() , 3 ) ;     // offset
    EXPECT_EQ( P.ptr() , &X ) ;       // ptr

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( P.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "x q[7];\n" ) ;
  }

}